

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_base.h
# Opt level: O2

bool CharToNetPacket(uchar *chardata,NetPacket *package)

{
  undefined8 uVar1;
  bool bVar2;
  undefined8 in_RAX;
  uint32_t tmp32;
  uint32_t local_14;
  
  local_14 = (uint32_t)((ulong)in_RAX >> 0x20);
  bVar2 = CharToInt32(chardata,&local_14);
  if (bVar2) {
    package->version = local_14;
    package->header = chardata[4];
    package->tail = chardata[5];
    uVar1 = *(undefined8 *)(chardata + 0xe);
    *(undefined8 *)package->check = *(undefined8 *)(chardata + 6);
    *(undefined8 *)(package->check + 8) = uVar1;
    bVar2 = CharToInt32(chardata + 0x16,&local_14);
    if (bVar2) {
      package->type = local_14;
      bVar2 = CharToInt32(chardata + 0x1a,&local_14);
      if (bVar2) {
        package->datalen = local_14;
        bVar2 = CharToInt32(chardata + 0x1e,&local_14);
        if (bVar2) {
          package->reserve = local_14;
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

inline bool CharToNetPacket(const unsigned char* chardata, NetPacket& package)
{
	uint32_t tmp32;
	if(!CharToInt32(chardata,tmp32)){
		return false;
	}
	package.version = tmp32;
	package.header = chardata[4];
	package.tail = chardata[5];
	memcpy(package.check,chardata+6,sizeof(package.check));
	if(!CharToInt32(chardata+22,tmp32)){
		return false;
	}
	package.type = tmp32;
	if(!CharToInt32(chardata+26,tmp32)){
		return false;
	}
	package.datalen = tmp32;
	if(!CharToInt32(chardata+30,tmp32)){
		return false;
	}
	package.reserve = tmp32;
	return true;
}